

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

void __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::condense_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
                *this,size_t N)

{
  tree_type *this_00;
  unsigned_long *puVar1;
  ulong uVar2;
  pointer bg_1;
  reference prVar3;
  const_reference puVar4;
  reference prVar5;
  reference puVar6;
  const_iterator i;
  iterator found;
  temporal_vec_type eliminated_nodes;
  undefined1 local_88 [16];
  vec_iterator<unsigned_long_*,_false> local_78 [2];
  vector_alloc_holder<boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
  local_68;
  unsigned_long local_50 [2];
  undefined1 *local_40;
  double *local_38;
  vec_iterator<unsigned_long_*,_true> local_30;
  vec_iterator<unsigned_long_*,_true> local_28;
  
  this_00 = &this->tree_;
  local_78[1].m_ptr = (unsigned_long *)N;
  prVar3 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(this_00,N);
  if (prVar3->is_leaf != false) {
    __assert_fail("node.is_leaf == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                  ,0x175,
                  "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_node(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                 );
  }
  local_28.m_ptr = (unsigned_long *)&prVar3->entry;
  uVar2 = (prVar3->entry).
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  if (uVar2 < 2) {
    if ((uVar2 == 1) && (prVar3->parent == 0xffffffffffffffff)) {
      puVar4 = boost::container::
               vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
               ::front((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                        *)local_28.m_ptr);
      this->root_ = *puVar4;
      erase_node(this,N);
      return;
    }
    local_68.m_start = local_50;
    local_68.m_size = 0;
    local_68.m_capacity = 2;
    local_30.m_ptr =
         (unsigned_long *)
         ((long)&(((container_type *)local_28.m_ptr)->
                 super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                 ).m_holder.super_static_storage_allocator<unsigned_long,_6UL,_0UL,_true>.storage +
         uVar2 * 8);
    std::
    copy<boost::container::vec_iterator<unsigned_long*,true>,std::back_insert_iterator<boost::container::small_vector<unsigned_long,2ul,std::allocator<unsigned_long>,void>>>
              (&local_28,&local_30,
               (small_vector<unsigned_long,_2UL,_std::allocator<unsigned_long>,_void> *)&local_68);
    prVar5 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_78[0].m_ptr = (unsigned_long *)&prVar5->entry;
    prVar5 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_38 = (prVar5->box).center.values_.elems +
               ((prVar5->entry).
                super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
                .m_holder.m_size - 7);
    std::find<boost::container::vec_iterator<unsigned_long*,false>,unsigned_long>
              ((vec_iterator<unsigned_long_*,_false> *)(local_88 + 8),local_78,
               (unsigned_long *)&local_38);
    prVar5 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    if ((double *)local_88._8_8_ ==
        (prVar5->box).center.values_.elems +
        ((prVar5->entry).
         super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
         .m_holder.m_size - 7)) {
      __assert_fail("found != this->tree_.at(node.parent).entry.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ToruNiina[P]periortree/periortree/rtree.hpp"
                    ,0x18c,
                    "void perior::rtree<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, perior::quadratic<6, 2>, perior::cubic_periodic_boundary<perior::point<double, 2>>>::condense_node(const std::size_t) [T = std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>, Params = perior::quadratic<6, 2>, Boundary = perior::cubic_periodic_boundary<perior::point<double, 2>>, IndexableGetter = perior::indexable_getter<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, EqualTo = std::equal_to<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>, Allocator = std::allocator<std::pair<perior::rectangle<perior::point<double, 2>>, unsigned long>>]"
                   );
    }
    prVar5 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    local_40 = (undefined1 *)local_88._8_8_;
    boost::container::
    vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
    ::erase((vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             *)local_88,(const_iterator *)&prVar5->entry);
    prVar5 = boost::container::
             vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
             ::at(this_00,prVar3->parent);
    condense_box(this,prVar5);
    local_88._0_8_ = local_68.m_start;
    puVar1 = (unsigned_long *)((long)local_68.m_start + local_68.m_size * 8);
    while ((unsigned_long *)local_88._0_8_ != puVar1) {
      puVar6 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*
                         ((vec_iterator<unsigned_long_*,_true> *)local_88);
      re_insert(this,*puVar6);
      boost::container::vec_iterator<unsigned_long_*,_true>::operator++
                ((vec_iterator<unsigned_long_*,_true> *)local_88);
    }
    condense_node(this,prVar3->parent);
    boost::container::
    vector_alloc_holder<boost::container::small_vector_allocator<unsigned_long,_std::allocator<void>,_void>,_unsigned_long,_boost::move_detail::integral_constant<unsigned_int,_1U>_>
    ::~vector_alloc_holder(&local_68);
  }
  return;
}

Assistant:

void condense_node(const std::size_t N)
    {
        const node_type& node = this->tree_.at(N);
        assert(node.is_leaf == false);

        if(node.has_enough_entry())
        {
            return;
        }
        if(node.parent == nil && node.entry.size() == 1)
        {
            this->root_ = node.entry.front();
            this->erase_node(N);
            return;
        }

        // collect index of nodes that are children of the node to be removed
        typedef typename gen_small_vector<std::size_t, min_entry>::type temporal_vec_type;
        temporal_vec_type eliminated_nodes;
        std::copy(node.entry.begin(), node.entry.end(),
                  std::back_inserter(eliminated_nodes));

        // erase the node N from its parent and condense its aabb
        typename node_type::iterator found = std::find(
                this->tree_.at(node.parent).entry.begin(),
                this->tree_.at(node.parent).entry.end(), N);
        assert(found != this->tree_.at(node.parent).entry.end());
        this->tree_.at(node.parent).entry.erase(found);
        this->condense_box(this->tree_.at(node.parent));

        // re-insert nodes eliminated from node N
        for(typename temporal_vec_type::const_iterator
                i(eliminated_nodes.begin()), e(eliminated_nodes.end()); i!=e; ++i)
        {
            this->re_insert(*i);
        }
        this->condense_node(node.parent);
        return;
    }